

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O2

bool __thiscall QMakeSourceFileInfo::findMocs(QMakeSourceFileInfo *this,SourceFile *file)

{
  char *__s;
  char cVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QString *pQVar7;
  char *buffer;
  long lVar8;
  size_t sVar9;
  int buffer_len;
  char16_t *pcVar10;
  char *needle;
  char *needle_00;
  bool *pbVar11;
  char *keyword;
  char (*__s_00) [19];
  long lVar12;
  long lVar13;
  long in_FS_OFFSET;
  int extralines_1;
  int extralines;
  int line_count;
  QMakeLocalFileName local_80;
  bool ignore [5];
  int morelines;
  undefined4 uStack_40;
  uint uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = '\x01';
  if ((file->field_0x3c & 8) == 0) {
    this->files_changed = true;
    file->field_0x3c = file->field_0x3c | 8;
    _morelines = 0xaaaaaaaaaaaaaaaa;
    uStack_40 = 0xaaaaaaaa;
    uStack_3c = 0xaaaaaaaa;
    (**this->_vptr_QMakeSourceFileInfo)(&local_80,this,file);
    pQVar7 = QMakeLocalFileName::local(&local_80);
    QFile::QFile((QFile *)&morelines,(QString *)pQVar7);
    QMakeLocalFileName::~QMakeLocalFileName(&local_80);
    cVar2 = QFile::open((QFile *)&morelines,1);
    if (cVar2 == '\0') {
      QFile::~QFile((QFile *)&morelines);
      cVar2 = '\0';
    }
    else {
      iVar4 = QFile::size();
      buffer = getBuffer(this,iVar4);
      iVar4 = 0;
      do {
        buffer_len = iVar4;
        iVar5 = QIODevice::read((char *)&morelines,(longlong)(buffer + buffer_len));
        iVar4 = buffer_len + iVar5;
      } while (iVar5 != 0);
      QFile::~QFile((QFile *)&morelines);
      if (Option::debug_level != 0) {
        QMakeLocalFileName::local(&file->file);
        QString::toLatin1_helper((QString *)&local_80);
        pcVar10 = local_80.real_name.d.ptr;
        if (local_80.real_name.d.ptr == (char16_t *)0x0) {
          pcVar10 = (char16_t *)&QByteArray::_empty;
        }
        debug_msg_internal(2,"findMocs: %s",pcVar10);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_80);
      }
      ignore[0] = false;
      ignore[1] = false;
      ignore[2] = false;
      ignore[3] = false;
      line_count = 1;
      ignore[4] = false;
      for (iVar4 = 0; iVar4 < buffer_len; iVar4 = iVar4 + 1) {
        iVar4 = skipEscapedLineEnds(buffer,buffer_len,iVar4,&line_count);
        cVar1 = buffer[iVar4];
        if ((cVar1 == '\"') || (cVar1 == '\'')) {
          iVar4 = scanPastString(buffer,buffer_len,iVar4,&line_count);
        }
        else if (cVar1 == '/') {
          extralines = 0;
          iVar5 = skipEscapedLineEnds(buffer,buffer_len,iVar4 + 1,&extralines);
          if (iVar5 < buffer_len) {
            if (buffer[iVar5] == '*') {
              line_count = line_count + extralines;
              do {
                while( true ) {
                  iVar5 = skipEscapedLineEnds(buffer,buffer_len,iVar5 + 1,&line_count);
                  iVar6 = line_count;
                  iVar4 = iVar5;
                  if (buffer_len <= iVar5) goto LAB_00169577;
                  cVar1 = buffer[iVar5];
                  if (cVar1 == '*') break;
                  if ((cVar1 == 't') || (cVar1 == 'q')) {
                    _morelines = 0x6e676920656b616d;
                    uStack_40 = 0x2065726f;
                    uStack_3c = uStack_3c & 0xffffff00;
                    pbVar11 = ignore;
                    for (lVar8 = 0; lVar8 != 0x5f; lVar8 = lVar8 + 0x13) {
                      __s = findMocs::keywords[0] + lVar8;
                      sVar9 = strlen(__s);
                      if ((int)sVar9 + iVar5 + 0xc <= buffer_len) {
                        bVar3 = findMocs::anon_class_1_0_00000001::operator()
                                          ((anon_class_1_0_00000001 *)(buffer + (long)iVar5 + 1),
                                           (char *)&morelines,needle);
                        if ((bVar3) &&
                           (bVar3 = findMocs::anon_class_1_0_00000001::operator()
                                              ((anon_class_1_0_00000001 *)
                                               (buffer + (long)iVar5 + 0xd),__s,needle_00), bVar3))
                        {
                          if (Option::debug_level != 0) {
                            QString::toLatin1_helper((QString *)&local_80);
                            pcVar10 = local_80.real_name.d.ptr;
                            if (local_80.real_name.d.ptr == (char16_t *)0x0) {
                              pcVar10 = (char16_t *)&QByteArray::_empty;
                            }
                            debug_msg_internal(2,"Mocgen: %s:%d Found \"q%s%s\"",pcVar10,
                                               (ulong)(uint)iVar6,&morelines,__s);
                            QArrayDataPointer<char>::~QArrayDataPointer
                                      ((QArrayDataPointer<char> *)&local_80);
                          }
                          sVar9 = strlen(__s);
                          iVar5 = iVar5 + (int)sVar9 + 0xc;
                          *pbVar11 = true;
                        }
                      }
                      pbVar11 = pbVar11 + 1;
                    }
                  }
                  else if ((Option::debug_level != 0) && ((cVar1 == '\r' || (cVar1 == '\n')))) {
                    line_count = line_count + 1;
                  }
                }
                extralines = 0;
                iVar4 = skipEscapedLineEnds(buffer,buffer_len,iVar5 + 1,&extralines);
              } while ((buffer_len <= iVar4) || (buffer[iVar4] != '/'));
              line_count = line_count + extralines;
            }
            else if (buffer[iVar5] == '/') {
              line_count = line_count + extralines;
              iVar4 = iVar5;
              do {
                iVar4 = skipEscapedLineEnds(buffer,buffer_len,iVar4 + 1,&line_count);
                if ((buffer_len <= iVar4) || (buffer[iVar4] == '\n')) break;
              } while (buffer[iVar4] != '\r');
            }
          }
        }
LAB_00169577:
        iVar5 = Option::debug_level;
        if ((Option::debug_level != 0 && iVar4 < buffer_len) &&
           ((buffer[iVar4] == '\r' || (buffer[iVar4] == '\n')))) {
          line_count = line_count + 1;
        }
        if ((iVar4 + 8 < buffer_len) && (bVar3 = isCWordChar(buffer[iVar4]), !bVar3)) {
          _morelines = _morelines & 0xffffffff00000000;
          iVar6 = skipEscapedLineEnds(buffer,buffer_len,iVar4 + 1,&morelines);
          lVar8 = (long)iVar6;
          if (buffer[lVar8] == 'Q') {
            __s_00 = findMocs::keywords;
            for (lVar13 = 0; lVar13 != 5; lVar13 = lVar13 + 1) {
              if (ignore[lVar13] == false) {
                extralines = 0;
                extralines_1 = 0;
                sVar9 = strlen(*__s_00);
                bVar3 = matchWhileUnsplitting
                                  (buffer,buffer_len,iVar6,*__s_00,(int)sVar9,&extralines,
                                   &extralines_1);
                if (((bVar3) && (lVar12 = extralines + lVar8, (int)lVar12 < buffer_len)) &&
                   (bVar3 = isCWordChar(buffer[lVar12]), !bVar3)) {
                  if ((iVar5 != 0) && (buffer[lVar12] = '\0', Option::debug_level != 0)) {
                    QString::toLatin1_helper((QString *)&local_80);
                    if (local_80.real_name.d.ptr == (char16_t *)0x0) {
                      local_80.real_name.d.ptr = (char16_t *)&QByteArray::_empty;
                    }
                    debug_msg_internal(2,"Mocgen: %s:%d Found MOC symbol %s",
                                       local_80.real_name.d.ptr,
                                       (ulong)(uint)(morelines + line_count),buffer + lVar8);
                    QArrayDataPointer<char>::~QArrayDataPointer
                              ((QArrayDataPointer<char> *)&local_80);
                  }
                  file->field_0x3c = file->field_0x3c | 1;
                  goto LAB_0016990f;
                }
              }
              __s_00 = __s_00 + 1;
            }
          }
        }
      }
    }
  }
LAB_0016990f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)cVar2;
}

Assistant:

bool QMakeSourceFileInfo::findMocs(SourceFile *file)
{
    if(file->moc_checked)
        return true;
    files_changed = true;
    file->moc_checked = true;

    int buffer_len = 0;
    char *buffer = nullptr;
    {
        QFile f(fixPathForFile(file->file, true).local());
        if (!f.open(QIODevice::ReadOnly))
            return false; //shouldn't happen
        const qint64 fs = f.size();
        buffer = getBuffer(fs);
        while (int have_read = f.read(buffer + buffer_len, fs - buffer_len))
            buffer_len += have_read;
    }

    debug_msg(2, "findMocs: %s", file->file.local().toLatin1().constData());
    int line_count = 1;
    enum Keywords {
        Q_OBJECT_Keyword,
        Q_GADGET_Keyword,
        Q_GADGET_EXPORT_Keyword,
        Q_NAMESPACE_Keyword,
        Q_NAMESPACE_EXPORT_Keyword,

        NumKeywords
    };
    static const char keywords[][19] = {
        "Q_OBJECT",
        "Q_GADGET",
        "Q_GADGET_EXPORT",
        "Q_NAMESPACE",
        "Q_NAMESPACE_EXPORT",
    };
    static_assert(std::size(keywords) == NumKeywords);
    bool ignore[NumKeywords] = {};
 /* qmake ignore Q_GADGET */
 /* qmake ignore Q_GADGET_EXPORT */
 /* qmake ignore Q_OBJECT */
 /* qmake ignore Q_NAMESPACE */
 /* qmake ignore Q_NAMESPACE_EXPORT */
    for(int x = 0; x < buffer_len; x++) {
#define SKIP_BSNL(pos) skipEscapedLineEnds(buffer, buffer_len, (pos), &line_count)
        x = SKIP_BSNL(x);
        if (buffer[x] == '/') {
            int extralines = 0;
            int y = skipEscapedLineEnds(buffer, buffer_len, x + 1, &extralines);
            if (buffer_len > y) {
                // If comment, advance to the character that ends it:
                if (buffer[y] == '/') { // C++-style comment
                    line_count += extralines;
                    x = y;
                    do {
                        x = SKIP_BSNL(x + 1);
                    } while (x < buffer_len && !qmake_endOfLine(buffer[x]));

                } else if (buffer[y] == '*') { // C-style comment
                    line_count += extralines;
                    x = SKIP_BSNL(y + 1);
                    for (; x < buffer_len; x = SKIP_BSNL(x + 1)) {
                        if (buffer[x] == 't' || buffer[x] == 'q') { // ignore
                            const char tag[] = "make ignore ";
                            const auto starts_with = [](const char *haystack, const char *needle) {
                                return strncmp(haystack, needle, strlen(needle)) == 0;
                            };
                            const auto is_ignore = [&](const char *keyword) {
                                return buffer_len >= int(x + strlen(tag) + strlen(keyword)) &&
                                        starts_with(buffer + x + 1, tag) &&
                                        starts_with(buffer + x + 1 + strlen(tag), keyword);
                            };
                            int interest = 0;
                            for (const char *keyword : keywords) {
                                if (is_ignore(keyword)){
                                    debug_msg(2, "Mocgen: %s:%d Found \"q%s%s\"",
                                              file->file.real().toLatin1().constData(), line_count,
                                              tag, keyword);
                                    x += static_cast<int>(strlen(tag));
                                    x += static_cast<int>(strlen(keyword));
                                    ignore[interest] = true;
                                }
                                ++interest;
                            }
                        } else if (buffer[x] == '*') {
                            extralines = 0;
                            y = skipEscapedLineEnds(buffer, buffer_len, x + 1, &extralines);
                            if (buffer_len > y && buffer[y] == '/') {
                                line_count += extralines;
                                x = y;
                                break;
                            }
                        } else if (Option::debug_level && qmake_endOfLine(buffer[x])) {
                            ++line_count;
                        }
                    }
                }
                // else: don't update x, buffer[x] is just the division operator.
            }
        } else if (buffer[x] == '\'' || buffer[x] == '"') {
            x = scanPastString(buffer, buffer_len, x, &line_count);
            // Leaves us on closing quote; for loop's x++ steps us past it.
        }

        if (x < buffer_len && Option::debug_level && qmake_endOfLine(buffer[x]))
            ++line_count;
        if (buffer_len > x + 8 && !isCWordChar(buffer[x])) {
            int morelines = 0;
            int y = skipEscapedLineEnds(buffer, buffer_len, x + 1, &morelines);
            if (buffer[y] == 'Q') {
                for (int interest = 0; interest < NumKeywords; ++interest) {
                    if (ignore[interest])
                        continue;

                    int matchlen = 0, extralines = 0;
                    size_t needle_len = strlen(keywords[interest]);
                    Q_ASSERT(needle_len <= INT_MAX);
                    if (matchWhileUnsplitting(buffer, buffer_len, y,
                                              keywords[interest],
                                              static_cast<int>(needle_len),
                                              &matchlen, &extralines)
                        && y + matchlen < buffer_len
                        && !isCWordChar(buffer[y + matchlen])) {
                        if (Option::debug_level) {
                            buffer[y + matchlen] = '\0';
                            debug_msg(2, "Mocgen: %s:%d Found MOC symbol %s",
                                      file->file.real().toLatin1().constData(),
                                      line_count + morelines, buffer + y);
                        }
                        file->mocable = true;
                        return true;
                    }
                }
            }
        }
#undef SKIP_BSNL
    }
    return true;
}